

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall CVmDateLocale::CVmDateLocale(CVmDateLocale *this)

{
  uint uVar1;
  long lVar2;
  vm_obj_id_t vVar3;
  int iVar4;
  CVmObjPageEntry *pCVar5;
  
  CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
  vVar3 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
  (**(code **)(*(long *)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].ptr_ + 8))
            (G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff),CVmObjClass::metaclass_reg_);
  vVar3 = CVmMetaclass::get_class_obj(CVmObjDate::metaclass_reg_);
  lVar2 = *(long *)((long)&G_obj_table_X.pages_[vVar3 >> 0xc][vVar3 & 0xfff].ptr_ + 8);
  if (*(int *)(lVar2 + 8) == 5) {
    uVar1 = *(uint *)(lVar2 + 0x10);
    this->vecid = uVar1;
    if (uVar1 != 0) {
      iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),
                         CVmObjVector::metaclass_reg_);
      if (iVar4 != 0) {
        pCVar5 = G_obj_table_X.pages_[this->vecid >> 0xc] + (this->vecid & 0xfff);
        goto LAB_0024e6d7;
      }
    }
  }
  else {
    this->vecid = 0;
  }
  pCVar5 = (CVmObjPageEntry *)0x0;
LAB_0024e6d7:
  this->vec = (CVmObjVector *)pCVar5;
  return;
}

Assistant:

CVmDateLocale(VMG0_)
    {
        /* get the state Vector from the Date static class state holder */
        const vm_val_t *val = vm_classobj_for(CVmObjDate)->get_class_state();
        vecid = val->typ == VM_OBJ ? val->val.obj : VM_INVALID_OBJ;
        vec = vm_objid_cast(CVmObjVector, vecid);
    }